

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O2

bool duckdb_re2::re2_internal::Parse<double>(char *str,size_t n,double *dest)

{
  char *__nptr;
  int *piVar1;
  double dVar2;
  size_t n_local;
  char *end;
  char buf [201];
  
  if (n != 0) {
    n_local = n;
    __nptr = TerminateNumber(buf,0xc9,str,&n_local,true);
    piVar1 = __errno_location();
    *piVar1 = 0;
    dVar2 = strtod(__nptr,&end);
    if ((end == __nptr + n_local) && (*piVar1 == 0)) {
      if (dest == (double *)0x0) {
        return true;
      }
      *dest = dVar2;
      return true;
    }
  }
  return false;
}

Assistant:

bool Parse(const char* str, size_t n, double* dest) {
  if (n == 0) return false;
  static const int kMaxLength = 200;
  char buf[kMaxLength+1];
  str = TerminateNumber(buf, sizeof buf, str, &n, true);
  char* end;
  errno = 0;
  double r = strtod(str, &end);
  if (end != str + n) return false;   // Leftover junk
  if (errno) return false;
  if (dest == NULL) return true;
  *dest = r;
  return true;
}